

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::BitSet::get(BitSet *this,XMLSize_t index)

{
  if (this->fUnitLen < index >> 5) {
    return false;
  }
  return (this->fBits[index >> 5] & (long)(1 << ((byte)index & 0x1f))) != 0;
}

Assistant:

bool BitSet::get(const XMLSize_t index) const
{
    const XMLSize_t unitOfBit = (index / kBitsPerUnit);
    const XMLSize_t bitWithinUnit = index % kBitsPerUnit;

    //
    //  If the index is beyond our size, don't actually expand. Just return
    //  false, which is what the state would be if we did expand it.
    //
    bool retVal = false;
    if (unitOfBit <= fUnitLen)
    {
        if (fBits[unitOfBit] & (1 << bitWithinUnit))
            retVal = true;
    }
    return retVal;
}